

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined8 *puVar15;
  float *pfVar16;
  float *pfVar17;
  int iVar18;
  undefined4 uVar19;
  RefCount RVar20;
  ushort uVar21;
  ushort uVar22;
  Scene *pSVar23;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  RTCFilterFunctionN p_Var28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  byte bVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [12];
  int iVar48;
  AABBNodeMB4D *node1;
  ulong uVar49;
  long lVar50;
  Scene *pSVar51;
  uint uVar52;
  NodeRef *pNVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  undefined4 uVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  size_t sVar65;
  ulong uVar66;
  byte bVar67;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar90;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar91;
  uint uVar109;
  uint uVar110;
  vint4 ai;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar111;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  uint uVar113;
  float fVar114;
  uint uVar123;
  uint uVar124;
  vint4 ai_2;
  undefined1 auVar115 [16];
  uint uVar125;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  uint uVar126;
  uint uVar131;
  uint uVar133;
  vint4 bi;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar134;
  uint uVar135;
  float fVar136;
  undefined1 auVar130 [16];
  vint4 ai_5;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar144;
  float fVar145;
  float fVar152;
  float fVar154;
  vint4 ai_1;
  float fVar156;
  uint uVar157;
  uint uVar167;
  uint uVar168;
  undefined1 auVar158 [12];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar153;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar155;
  float fVar166;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  uint uVar169;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar170;
  float fVar173;
  float fVar179;
  float fVar182;
  vint4 ai_7;
  float fVar171;
  float fVar172;
  float fVar185;
  undefined1 auVar174 [16];
  float fVar180;
  float fVar183;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar181;
  float fVar184;
  float fVar186;
  undefined1 auVar178 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar202;
  float fVar203;
  undefined1 auVar192 [16];
  float fVar196;
  float fVar200;
  float fVar201;
  float fVar204;
  float fVar205;
  undefined1 auVar193 [16];
  float fVar206;
  float fVar207;
  float fVar211;
  float fVar212;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar220;
  undefined1 auVar219 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar230;
  float fVar232;
  undefined1 auVar228 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [16];
  UVIdentity<4> mapUV;
  Scene *local_d38;
  undefined1 local_d28 [8];
  float fStack_d20;
  float fStack_d1c;
  NodeRef *local_d00;
  float old_t_1;
  float fStack_cf4;
  undefined8 uStack_cf0;
  float old_t;
  NodeRef *local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined4 uStack_c8c;
  byte local_c78;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  RefCount local_c38;
  undefined1 local_c28 [8];
  float fStack_c20;
  Scene *local_c10;
  long local_c08;
  long local_c00;
  RTCFilterFunctionNArguments args;
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  vint4 bi_5;
  vint4 bi_2;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined1 local_998 [16];
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  uint local_968;
  uint uStack_964;
  uint uStack_960;
  uint uStack_95c;
  uint local_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined8 local_918;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack [244];
  
  local_cc0 = stack + 1;
  stack[0] = root;
  fVar90 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar114 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar221 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_908 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar144 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar155 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar187 = local_908 * 0.99999964;
  fVar206 = fVar144 * 0.99999964;
  fVar170 = fVar155 * 0.99999964;
  local_908 = local_908 * 1.0000004;
  fVar144 = fVar144 * 1.0000004;
  fVar155 = fVar155 * 1.0000004;
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar18 = (tray->tnear).field_0.i[k];
  auVar208._4_4_ = iVar18;
  auVar208._0_4_ = iVar18;
  auVar208._8_4_ = iVar18;
  auVar208._12_4_ = iVar18;
  iVar48 = (tray->tfar).field_0.i[k];
  aVar213.i[1] = iVar48;
  aVar213.i[0] = iVar48;
  aVar213.i[2] = iVar48;
  aVar213.i[3] = iVar48;
  local_c10 = (Scene *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8d8 = fVar90;
  fStack_8d4 = fVar90;
  fStack_8d0 = fVar90;
  fStack_8cc = fVar90;
  local_8e8 = fVar114;
  fStack_8e4 = fVar114;
  fStack_8e0 = fVar114;
  fStack_8dc = fVar114;
  local_8f8 = fVar221;
  fStack_8f4 = fVar221;
  fStack_8f0 = fVar221;
  fStack_8ec = fVar221;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  local_a28 = fVar144;
  fStack_a24 = fVar144;
  fStack_a20 = fVar144;
  fStack_a1c = fVar144;
  local_a38 = fVar155;
  fStack_a34 = fVar155;
  fStack_a30 = fVar155;
  fStack_a2c = fVar155;
  local_a48 = fVar170;
  fStack_a44 = fVar170;
  fStack_a40 = fVar170;
  fStack_a3c = fVar170;
  bi_5.field_0 = aVar213;
  fVar216 = fVar114;
  fVar132 = fVar114;
  fVar134 = fVar114;
  fVar136 = fVar221;
  fVar145 = fVar221;
  fVar153 = fVar221;
  fVar204 = fVar144;
  fVar91 = fVar144;
  fVar156 = fVar144;
  fVar166 = fVar155;
  fVar184 = fVar155;
  fVar186 = fVar155;
  fVar173 = fVar170;
  fVar181 = fVar170;
  fVar188 = fVar170;
  fVar201 = fVar90;
  fVar205 = fVar90;
  fVar207 = fVar90;
  fVar211 = local_908;
  fVar212 = local_908;
  do {
    if (local_cc0 == stack) {
LAB_0073eced:
      return local_cc0 != stack;
    }
    local_d00 = local_cc0 + -1;
    sVar65 = local_cc0[-1].ptr;
    pNVar53 = local_cc0;
    while ((sVar65 & 8) == 0) {
      uVar49 = sVar65 & 0xfffffffffffffff0;
      fVar197 = *(float *)(ray + k * 4 + 0x70);
      pfVar17 = (float *)(uVar49 + 0x80 + uVar64);
      pfVar16 = (float *)(uVar49 + 0x20 + uVar64);
      auVar115._0_4_ = ((*pfVar17 * fVar197 + *pfVar16) - fVar90) * fVar187;
      auVar115._4_4_ = ((pfVar17[1] * fVar197 + pfVar16[1]) - fVar201) * fVar187;
      auVar115._8_4_ = ((pfVar17[2] * fVar197 + pfVar16[2]) - fVar205) * fVar187;
      auVar115._12_4_ = ((pfVar17[3] * fVar197 + pfVar16[3]) - fVar207) * fVar187;
      pfVar17 = (float *)(uVar49 + 0x80 + uVar61);
      pfVar16 = (float *)(uVar49 + 0x20 + uVar61);
      auVar148._0_4_ = ((*pfVar17 * fVar197 + *pfVar16) - fVar114) * fVar206;
      auVar148._4_4_ = ((pfVar17[1] * fVar197 + pfVar16[1]) - fVar216) * fVar206;
      auVar148._8_4_ = ((pfVar17[2] * fVar197 + pfVar16[2]) - fVar132) * fVar206;
      auVar148._12_4_ = ((pfVar17[3] * fVar197 + pfVar16[3]) - fVar134) * fVar206;
      pfVar17 = (float *)(uVar49 + 0x80 + uVar66);
      pfVar16 = (float *)(uVar49 + 0x20 + uVar66);
      auVar92._0_4_ = ((*pfVar17 * fVar197 + *pfVar16) - fVar221) * fVar170;
      auVar92._4_4_ = ((pfVar17[1] * fVar197 + pfVar16[1]) - fVar136) * fVar173;
      auVar92._8_4_ = ((pfVar17[2] * fVar197 + pfVar16[2]) - fVar145) * fVar181;
      auVar92._12_4_ = ((pfVar17[3] * fVar197 + pfVar16[3]) - fVar153) * fVar188;
      auVar127 = maxps(auVar148,auVar92);
      auVar92 = maxps(auVar208,auVar115);
      auVar92 = maxps(auVar92,auVar127);
      pfVar17 = (float *)(uVar49 + 0x80 + (uVar64 ^ 0x10));
      pfVar16 = (float *)(uVar49 + 0x20 + (uVar64 ^ 0x10));
      auVar160._0_4_ = ((*pfVar17 * fVar197 + *pfVar16) - fVar90) * local_908;
      auVar160._4_4_ = ((pfVar17[1] * fVar197 + pfVar16[1]) - fVar201) * fStack_904;
      auVar160._8_4_ = ((pfVar17[2] * fVar197 + pfVar16[2]) - fVar205) * fVar211;
      auVar160._12_4_ = ((pfVar17[3] * fVar197 + pfVar16[3]) - fVar207) * fVar212;
      pfVar17 = (float *)(uVar49 + 0x80 + (uVar61 ^ 0x10));
      pfVar16 = (float *)(uVar49 + 0x20 + (uVar61 ^ 0x10));
      auVar177._0_4_ = ((*pfVar17 * fVar197 + *pfVar16) - fVar114) * fVar144;
      auVar177._4_4_ = ((pfVar17[1] * fVar197 + pfVar16[1]) - fVar216) * fVar204;
      auVar177._8_4_ = ((pfVar17[2] * fVar197 + pfVar16[2]) - fVar132) * fVar91;
      auVar177._12_4_ = ((pfVar17[3] * fVar197 + pfVar16[3]) - fVar134) * fVar156;
      pfVar17 = (float *)(uVar49 + 0x80 + (uVar66 ^ 0x10));
      pfVar16 = (float *)(uVar49 + 0x20 + (uVar66 ^ 0x10));
      auVar127._0_4_ = ((*pfVar17 * fVar197 + *pfVar16) - fVar221) * fVar155;
      auVar127._4_4_ = ((pfVar17[1] * fVar197 + pfVar16[1]) - fVar136) * fVar166;
      auVar127._8_4_ = ((pfVar17[2] * fVar197 + pfVar16[2]) - fVar145) * fVar184;
      auVar127._12_4_ = ((pfVar17[3] * fVar197 + pfVar16[3]) - fVar153) * fVar186;
      auVar127 = minps(auVar177,auVar127);
      auVar115 = minps((undefined1  [16])aVar213,auVar160);
      auVar115 = minps(auVar115,auVar127);
      bVar30 = auVar92._0_4_ <= auVar115._0_4_;
      bVar31 = auVar92._4_4_ <= auVar115._4_4_;
      bVar32 = auVar92._8_4_ <= auVar115._8_4_;
      bVar33 = auVar92._12_4_ <= auVar115._12_4_;
      if (((uint)sVar65 & 7) == 6) {
        bVar30 = (fVar197 < *(float *)(uVar49 + 0xf0) && *(float *)(uVar49 + 0xe0) <= fVar197) &&
                 bVar30;
        bVar31 = (fVar197 < *(float *)(uVar49 + 0xf4) && *(float *)(uVar49 + 0xe4) <= fVar197) &&
                 bVar31;
        bVar32 = (fVar197 < *(float *)(uVar49 + 0xf8) && *(float *)(uVar49 + 0xe8) <= fVar197) &&
                 bVar32;
        bVar33 = (fVar197 < *(float *)(uVar49 + 0xfc) && *(float *)(uVar49 + 0xec) <= fVar197) &&
                 bVar33;
      }
      auVar93._0_4_ = (uint)bVar30 * -0x80000000;
      auVar93._4_4_ = (uint)bVar31 * -0x80000000;
      auVar93._8_4_ = (uint)bVar32 * -0x80000000;
      auVar93._12_4_ = (uint)bVar33 * -0x80000000;
      uVar52 = movmskps((int)pNVar53,auVar93);
      if (uVar52 == 0) goto LAB_0073ecbf;
      uVar52 = uVar52 & 0xff;
      root.ptr = (size_t)uVar52;
      lVar56 = 0;
      if ((NodeRef *)root.ptr != (NodeRef *)0x0) {
        for (; (uVar52 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
        }
      }
      sVar65 = *(size_t *)(uVar49 + lVar56 * 8);
      uVar52 = uVar52 - 1 & uVar52;
      pNVar53 = (NodeRef *)(ulong)uVar52;
      if (uVar52 != 0) {
        do {
          root.ptr = (size_t)pNVar53;
          local_d00->ptr = sVar65;
          local_d00 = local_d00 + 1;
          lVar56 = 0;
          if ((NodeRef *)root.ptr != (NodeRef *)0x0) {
            for (; (root.ptr >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
            }
          }
          sVar65 = *(size_t *)(uVar49 + lVar56 * 8);
          pNVar53 = (NodeRef *)((ulong)((long)&((NodeRef *)(root.ptr + -8))->ptr + 7U) & root.ptr);
        } while (pNVar53 != (NodeRef *)0x0);
      }
    }
    uVar49 = sVar65 & 0xfffffffffffffff0;
    for (lVar56 = 0; lVar56 != (ulong)((uint)sVar65 & 0xf) - 8; lVar56 = lVar56 + 1) {
      lVar50 = lVar56 * 0x90;
      fVar112 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar49 + 0x80 + lVar50)) *
                *(float *)(uVar49 + 0x84 + lVar50);
      uVar60 = *(ulong *)(uVar49 + 0x20 + lVar50);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar60;
      uVar55 = *(ulong *)(uVar49 + 0x24 + lVar50);
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uVar55;
      bVar34 = (byte)uVar55;
      bVar67 = (byte)uVar60;
      bVar35 = (byte)(uVar55 >> 8);
      bVar84 = (byte)(uVar60 >> 8);
      bVar36 = (byte)(uVar55 >> 0x10);
      bVar85 = (byte)(uVar60 >> 0x10);
      bVar37 = (byte)(uVar55 >> 0x18);
      bVar86 = (byte)(uVar60 >> 0x18);
      bVar38 = (byte)(uVar55 >> 0x20);
      bVar87 = (byte)(uVar60 >> 0x20);
      bVar39 = (byte)(uVar55 >> 0x28);
      bVar88 = (byte)(uVar60 >> 0x28);
      bVar40 = (byte)(uVar55 >> 0x30);
      bVar89 = (byte)(uVar60 >> 0x30);
      bVar43 = (byte)(uVar60 >> 0x38);
      bVar41 = (byte)(uVar55 >> 0x38);
      auVar68[0] = -((byte)((bVar34 < bVar67) * bVar34 | (bVar34 >= bVar67) * bVar67) == bVar67);
      auVar68[1] = -((byte)((bVar35 < bVar84) * bVar35 | (bVar35 >= bVar84) * bVar84) == bVar84);
      auVar68[2] = -((byte)((bVar36 < bVar85) * bVar36 | (bVar36 >= bVar85) * bVar85) == bVar85);
      auVar68[3] = -((byte)((bVar37 < bVar86) * bVar37 | (bVar37 >= bVar86) * bVar86) == bVar86);
      auVar68[4] = -((byte)((bVar38 < bVar87) * bVar38 | (bVar38 >= bVar87) * bVar87) == bVar87);
      auVar68[5] = -((byte)((bVar39 < bVar88) * bVar39 | (bVar39 >= bVar88) * bVar88) == bVar88);
      auVar68[6] = -((byte)((bVar40 < bVar89) * bVar40 | (bVar40 >= bVar89) * bVar89) == bVar89);
      auVar68[7] = -((byte)((bVar41 < bVar43) * bVar41 | (bVar41 >= bVar43) * bVar43) == bVar43);
      auVar68[8] = 0xff;
      auVar68[9] = 0xff;
      auVar68[10] = 0xff;
      auVar68[0xb] = 0xff;
      auVar68[0xc] = 0xff;
      auVar68[0xd] = 0xff;
      auVar68[0xe] = 0xff;
      auVar68[0xf] = 0xff;
      auVar92 = pmovzxbd(auVar94,auVar94);
      fVar144 = *(float *)(uVar49 + 0x38 + lVar50);
      fVar155 = *(float *)(uVar49 + 0x3c + lVar50);
      fVar204 = *(float *)(uVar49 + 0x40 + lVar50);
      fVar91 = *(float *)(uVar49 + 0x44 + lVar50);
      fVar188 = (float)auVar92._0_4_ * fVar91 + fVar144;
      fVar170 = (float)auVar92._4_4_ * fVar91 + fVar144;
      fVar197 = (float)auVar92._8_4_ * fVar91 + fVar144;
      fVar202 = (float)auVar92._12_4_ * fVar91 + fVar144;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = *(ulong *)(uVar49 + 0x50 + lVar50);
      auVar92 = pmovzxbd(auVar95,auVar95);
      fVar156 = *(float *)(uVar49 + 0x74 + lVar50);
      fVar166 = *(float *)(uVar49 + 0x68 + lVar50);
      auVar115 = pmovzxbd(auVar128,auVar128);
      fVar189 = (float)auVar115._0_4_ * fVar91 + fVar144;
      fVar194 = (float)auVar115._4_4_ * fVar91 + fVar144;
      fVar198 = (float)auVar115._8_4_ * fVar91 + fVar144;
      fVar144 = (float)auVar115._12_4_ * fVar91 + fVar144;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = *(ulong *)(uVar49 + 0x54 + lVar50);
      auVar115 = pmovzxbd(auVar129,auVar129);
      auVar146._8_8_ = 0;
      auVar146._0_8_ = *(ulong *)(uVar49 + 0x28 + lVar50);
      auVar127 = pmovzxbd(auVar146,auVar146);
      fVar91 = *(float *)(uVar49 + 0x48 + lVar50);
      fVar171 = (float)auVar127._0_4_ * fVar91 + fVar155;
      fVar179 = (float)auVar127._4_4_ * fVar91 + fVar155;
      fVar182 = (float)auVar127._8_4_ * fVar91 + fVar155;
      fVar185 = (float)auVar127._12_4_ * fVar91 + fVar155;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = *(ulong *)(uVar49 + 0x58 + lVar50);
      auVar148 = pmovzxbd(auVar147,auVar147);
      fVar184 = *(float *)(uVar49 + 0x78 + lVar50);
      fVar186 = *(float *)(uVar49 + 0x6c + lVar50);
      auVar174._8_8_ = 0;
      auVar174._0_8_ = *(ulong *)(uVar49 + 0x2c + lVar50);
      auVar127 = pmovzxbd(auVar174,auVar174);
      fVar172 = (float)auVar127._0_4_ * fVar91 + fVar155;
      fVar180 = (float)auVar127._4_4_ * fVar91 + fVar155;
      fVar183 = (float)auVar127._8_4_ * fVar91 + fVar155;
      fVar155 = (float)auVar127._12_4_ * fVar91 + fVar155;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = *(ulong *)(uVar49 + 0x5c + lVar50);
      auVar160 = pmovzxbd(auVar159,auVar159);
      auVar175._8_8_ = 0;
      auVar175._0_8_ = *(ulong *)(uVar49 + 0x30 + lVar50);
      auVar127 = pmovzxbd(auVar175,auVar175);
      fVar91 = *(float *)(uVar49 + 0x4c + lVar50);
      fVar190 = (float)auVar127._0_4_ * fVar91 + fVar204;
      fVar195 = (float)auVar127._4_4_ * fVar91 + fVar204;
      fVar199 = (float)auVar127._8_4_ * fVar91 + fVar204;
      fVar203 = (float)auVar127._12_4_ * fVar91 + fVar204;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = *(ulong *)(uVar49 + 0x60 + lVar50);
      auVar177 = pmovzxbd(auVar176,auVar176);
      fVar173 = *(float *)(uVar49 + 0x7c + lVar50);
      fVar181 = *(float *)(uVar49 + 0x70 + lVar50);
      auVar192._8_8_ = 0;
      auVar192._0_8_ = *(ulong *)(uVar49 + 0x34 + lVar50);
      auVar127 = pmovzxbd(auVar192,auVar192);
      fVar191 = (float)auVar127._0_4_ * fVar91 + fVar204;
      fVar196 = (float)auVar127._4_4_ * fVar91 + fVar204;
      fVar200 = (float)auVar127._8_4_ * fVar91 + fVar204;
      fVar204 = (float)auVar127._12_4_ * fVar91 + fVar204;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = *(ulong *)(uVar49 + 100 + lVar50);
      auVar127 = pmovzxbd(auVar137,auVar137);
      fVar91 = (((((float)auVar92._0_4_ * fVar156 + fVar166) - fVar188) * fVar112 + fVar188) -
               fVar90) * fVar187;
      fVar188 = (((((float)auVar92._4_4_ * fVar156 + fVar166) - fVar170) * fVar112 + fVar170) -
                fVar201) * fVar187;
      fVar170 = (((((float)auVar92._8_4_ * fVar156 + fVar166) - fVar197) * fVar112 + fVar197) -
                fVar205) * fVar187;
      fVar197 = (((((float)auVar92._12_4_ * fVar156 + fVar166) - fVar202) * fVar112 + fVar202) -
                fVar207) * fVar187;
      fVar202 = (((((float)auVar148._0_4_ * fVar184 + fVar186) - fVar171) * fVar112 + fVar171) -
                fVar114) * fVar206;
      fVar152 = (((((float)auVar148._4_4_ * fVar184 + fVar186) - fVar179) * fVar112 + fVar179) -
                fVar216) * fVar206;
      fVar154 = (((((float)auVar148._8_4_ * fVar184 + fVar186) - fVar182) * fVar112 + fVar182) -
                fVar132) * fVar206;
      fVar185 = (((((float)auVar148._12_4_ * fVar184 + fVar186) - fVar185) * fVar112 + fVar185) -
                fVar134) * fVar206;
      fVar171 = (((((float)auVar115._0_4_ * fVar156 + fVar166) - fVar189) * fVar112 + fVar189) -
                fVar90) * local_908;
      fVar179 = (((((float)auVar115._4_4_ * fVar156 + fVar166) - fVar194) * fVar112 + fVar194) -
                fVar201) * fStack_904;
      fVar182 = (((((float)auVar115._8_4_ * fVar156 + fVar166) - fVar198) * fVar112 + fVar198) -
                fVar205) * fVar211;
      fVar144 = (((((float)auVar115._12_4_ * fVar156 + fVar166) - fVar144) * fVar112 + fVar144) -
                fVar207) * fVar212;
      fVar156 = (((((float)auVar160._0_4_ * fVar184 + fVar186) - fVar172) * fVar112 + fVar172) -
                fVar114) * local_a28;
      fVar166 = (((((float)auVar160._4_4_ * fVar184 + fVar186) - fVar180) * fVar112 + fVar180) -
                fVar216) * fStack_a24;
      fVar172 = (((((float)auVar160._8_4_ * fVar184 + fVar186) - fVar183) * fVar112 + fVar183) -
                fVar132) * fStack_a20;
      fVar155 = (((((float)auVar160._12_4_ * fVar184 + fVar186) - fVar155) * fVar112 + fVar155) -
                fVar134) * fStack_a1c;
      uVar113 = (uint)((int)fVar171 < (int)fVar91) * (int)fVar171 |
                (uint)((int)fVar171 >= (int)fVar91) * (int)fVar91;
      uVar123 = (uint)((int)fVar179 < (int)fVar188) * (int)fVar179 |
                (uint)((int)fVar179 >= (int)fVar188) * (int)fVar188;
      uVar124 = (uint)((int)fVar182 < (int)fVar170) * (int)fVar182 |
                (uint)((int)fVar182 >= (int)fVar170) * (int)fVar170;
      uVar125 = (uint)((int)fVar144 < (int)fVar197) * (int)fVar144 |
                (uint)((int)fVar144 >= (int)fVar197) * (int)fVar197;
      uVar126 = (uint)((int)fVar171 < (int)fVar91) * (int)fVar91 |
                (uint)((int)fVar171 >= (int)fVar91) * (int)fVar171;
      uVar131 = (uint)((int)fVar179 < (int)fVar188) * (int)fVar188 |
                (uint)((int)fVar179 >= (int)fVar188) * (int)fVar179;
      uVar133 = (uint)((int)fVar182 < (int)fVar170) * (int)fVar170 |
                (uint)((int)fVar182 >= (int)fVar170) * (int)fVar182;
      uVar135 = (uint)((int)fVar144 < (int)fVar197) * (int)fVar197 |
                (uint)((int)fVar144 >= (int)fVar197) * (int)fVar144;
      uVar52 = (uint)((int)fVar156 < (int)fVar202) * (int)fVar156 |
               (uint)((int)fVar156 >= (int)fVar202) * (int)fVar202;
      uVar109 = (uint)((int)fVar166 < (int)fVar152) * (int)fVar166 |
                (uint)((int)fVar166 >= (int)fVar152) * (int)fVar152;
      uVar110 = (uint)((int)fVar172 < (int)fVar154) * (int)fVar172 |
                (uint)((int)fVar172 >= (int)fVar154) * (int)fVar154;
      uVar111 = (uint)((int)fVar155 < (int)fVar185) * (int)fVar155 |
                (uint)((int)fVar155 >= (int)fVar185) * (int)fVar185;
      uVar52 = ((int)uVar52 < (int)uVar113) * uVar113 | ((int)uVar52 >= (int)uVar113) * uVar52;
      uVar109 = ((int)uVar109 < (int)uVar123) * uVar123 | ((int)uVar109 >= (int)uVar123) * uVar109;
      uVar110 = ((int)uVar110 < (int)uVar124) * uVar124 | ((int)uVar110 >= (int)uVar124) * uVar110;
      uVar111 = ((int)uVar111 < (int)uVar125) * uVar125 | ((int)uVar111 >= (int)uVar125) * uVar111;
      uVar113 = (uint)((int)fVar156 < (int)fVar202) * (int)fVar202 |
                (uint)((int)fVar156 >= (int)fVar202) * (int)fVar156;
      uVar123 = (uint)((int)fVar166 < (int)fVar152) * (int)fVar152 |
                (uint)((int)fVar166 >= (int)fVar152) * (int)fVar166;
      uVar124 = (uint)((int)fVar172 < (int)fVar154) * (int)fVar154 |
                (uint)((int)fVar172 >= (int)fVar154) * (int)fVar172;
      uVar125 = (uint)((int)fVar155 < (int)fVar185) * (int)fVar185 |
                (uint)((int)fVar155 >= (int)fVar185) * (int)fVar155;
      fVar156 = (((((float)auVar177._0_4_ * fVar173 + fVar181) - fVar190) * fVar112 + fVar190) -
                fVar221) * local_a48;
      fVar166 = (((((float)auVar177._4_4_ * fVar173 + fVar181) - fVar195) * fVar112 + fVar195) -
                fVar136) * fStack_a44;
      fVar184 = (((((float)auVar177._8_4_ * fVar173 + fVar181) - fVar199) * fVar112 + fVar199) -
                fVar145) * fStack_a40;
      fVar186 = (((((float)auVar177._12_4_ * fVar173 + fVar181) - fVar203) * fVar112 + fVar203) -
                fVar153) * fStack_a3c;
      fVar144 = (((((float)auVar127._0_4_ * fVar173 + fVar181) - fVar191) * fVar112 + fVar191) -
                fVar221) * local_a38;
      fVar155 = (((((float)auVar127._4_4_ * fVar173 + fVar181) - fVar196) * fVar112 + fVar196) -
                fVar136) * fStack_a34;
      fVar91 = (((((float)auVar127._8_4_ * fVar173 + fVar181) - fVar200) * fVar112 + fVar200) -
               fVar145) * fStack_a30;
      fVar204 = (((((float)auVar127._12_4_ * fVar173 + fVar181) - fVar204) * fVar112 + fVar204) -
                fVar153) * fStack_a2c;
      uVar157 = ((int)uVar126 < (int)uVar113) * uVar126 | ((int)uVar126 >= (int)uVar113) * uVar113;
      uVar167 = ((int)uVar131 < (int)uVar123) * uVar131 | ((int)uVar131 >= (int)uVar123) * uVar123;
      uVar168 = ((int)uVar133 < (int)uVar124) * uVar133 | ((int)uVar133 >= (int)uVar124) * uVar124;
      uVar169 = ((int)uVar135 < (int)uVar125) * uVar135 | ((int)uVar135 >= (int)uVar125) * uVar125;
      uVar113 = (uint)((int)fVar144 < (int)fVar156) * (int)fVar144 |
                (uint)((int)fVar144 >= (int)fVar156) * (int)fVar156;
      uVar123 = (uint)((int)fVar155 < (int)fVar166) * (int)fVar155 |
                (uint)((int)fVar155 >= (int)fVar166) * (int)fVar166;
      uVar124 = (uint)((int)fVar91 < (int)fVar184) * (int)fVar91 |
                (uint)((int)fVar91 >= (int)fVar184) * (int)fVar184;
      uVar125 = (uint)((int)fVar204 < (int)fVar186) * (int)fVar204 |
                (uint)((int)fVar204 >= (int)fVar186) * (int)fVar186;
      uVar126 = (uint)((int)fVar144 < (int)fVar156) * (int)fVar156 |
                (uint)((int)fVar144 >= (int)fVar156) * (int)fVar144;
      uVar131 = (uint)((int)fVar155 < (int)fVar166) * (int)fVar166 |
                (uint)((int)fVar155 >= (int)fVar166) * (int)fVar155;
      uVar133 = (uint)((int)fVar91 < (int)fVar184) * (int)fVar184 |
                (uint)((int)fVar91 >= (int)fVar184) * (int)fVar91;
      uVar135 = (uint)((int)fVar204 < (int)fVar186) * (int)fVar186 |
                (uint)((int)fVar204 >= (int)fVar186) * (int)fVar204;
      uVar113 = (uint)((int)uVar113 < iVar18) * iVar18 | ((int)uVar113 >= iVar18) * uVar113;
      uVar123 = (uint)((int)uVar123 < iVar18) * iVar18 | ((int)uVar123 >= iVar18) * uVar123;
      uVar124 = (uint)((int)uVar124 < iVar18) * iVar18 | ((int)uVar124 >= iVar18) * uVar124;
      uVar125 = (uint)((int)uVar125 < iVar18) * iVar18 | ((int)uVar125 >= iVar18) * uVar125;
      iVar48 = bi_5.field_0._0_4_;
      uVar126 = (uint)(iVar48 < (int)uVar126) * iVar48 | (iVar48 >= (int)uVar126) * uVar126;
      iVar48 = bi_5.field_0._4_4_;
      uVar131 = (uint)(iVar48 < (int)uVar131) * iVar48 | (iVar48 >= (int)uVar131) * uVar131;
      iVar48 = bi_5.field_0._8_4_;
      uVar133 = (uint)(iVar48 < (int)uVar133) * iVar48 | (iVar48 >= (int)uVar133) * uVar133;
      iVar48 = bi_5.field_0._12_4_;
      uVar135 = (uint)(iVar48 < (int)uVar135) * iVar48 | (iVar48 >= (int)uVar135) * uVar135;
      auVar116._0_4_ =
           -(uint)((int)(((int)uVar157 < (int)uVar126) * uVar157 |
                        ((int)uVar157 >= (int)uVar126) * uVar126) <
                  (int)(((int)uVar113 < (int)uVar52) * uVar52 |
                       ((int)uVar113 >= (int)uVar52) * uVar113));
      auVar116._4_4_ =
           -(uint)((int)(((int)uVar167 < (int)uVar131) * uVar167 |
                        ((int)uVar167 >= (int)uVar131) * uVar131) <
                  (int)(((int)uVar123 < (int)uVar109) * uVar109 |
                       ((int)uVar123 >= (int)uVar109) * uVar123));
      auVar116._8_4_ =
           -(uint)((int)(((int)uVar168 < (int)uVar133) * uVar168 |
                        ((int)uVar168 >= (int)uVar133) * uVar133) <
                  (int)(((int)uVar124 < (int)uVar110) * uVar110 |
                       ((int)uVar124 >= (int)uVar110) * uVar124));
      auVar116._12_4_ =
           -(uint)((int)(((int)uVar169 < (int)uVar135) * uVar169 |
                        ((int)uVar169 >= (int)uVar135) * uVar135) <
                  (int)(((int)uVar125 < (int)uVar111) * uVar111 |
                       ((int)uVar125 >= (int)uVar111) * uVar125));
      auVar92 = pmovsxbd(auVar68,auVar68);
      uVar57 = movmskps((int)root.ptr,~auVar116 & auVar92);
      lVar50 = lVar50 + uVar49;
      for (uVar60 = CONCAT44((int)(root.ptr >> 0x20),uVar57); uVar60 != 0;
          uVar60 = uVar60 & uVar60 - 1) {
        lVar29 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
          }
        }
        uVar21 = *(ushort *)(lVar50 + lVar29 * 8);
        uVar22 = *(ushort *)(lVar50 + 2 + lVar29 * 8);
        uVar52 = *(uint *)(lVar50 + 0x88);
        uVar109 = *(uint *)(lVar50 + 4 + lVar29 * 8);
        pSVar23 = context->scene;
        pGVar24 = (pSVar23->geometries).items[uVar52].ptr;
        local_c00 = *(long *)&pGVar24->field_0x58;
        local_c08 = (ulong)uVar109 *
                    pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        fVar90 = pGVar24->fnumTimeSegments;
        fVar114 = (pGVar24->time_range).lower;
        auVar117._0_4_ = (pGVar24->time_range).upper - fVar114;
        auVar96._4_4_ = fVar114;
        auVar96._0_4_ = fVar114;
        auVar96._8_4_ = fVar114;
        auVar96._12_4_ = fVar114;
        auVar138._0_4_ = *(float *)(ray + 0x70) - fVar114;
        auVar138._4_4_ = *(float *)(ray + 0x74) - fVar114;
        auVar138._8_4_ = *(float *)(ray + 0x78) - fVar114;
        auVar138._12_4_ = *(float *)(ray + 0x7c) - fVar114;
        auVar117._4_4_ = auVar117._0_4_;
        auVar117._8_4_ = auVar117._0_4_;
        auVar117._12_4_ = auVar117._0_4_;
        auVar92 = divps(auVar138,auVar117);
        auVar139._0_4_ = auVar92._0_4_ * fVar90;
        auVar139._4_4_ = auVar92._4_4_ * fVar90;
        auVar139._8_4_ = auVar92._8_4_ * fVar90;
        auVar139._12_4_ = auVar92._12_4_ * fVar90;
        auVar92 = roundps(auVar96,auVar139,1);
        auVar69._0_4_ = fVar90 + -1.0;
        auVar69._4_4_ = auVar69._0_4_;
        auVar69._8_4_ = auVar69._0_4_;
        auVar69._12_4_ = auVar69._0_4_;
        auVar92 = minps(auVar92,auVar69);
        auVar92 = maxps(auVar92,_DAT_01f45a50);
        ftime.field_0.v[0] = auVar139._0_4_ - auVar92._0_4_;
        ftime.field_0.v[1] = auVar139._4_4_ - auVar92._4_4_;
        ftime.field_0.v[2] = auVar139._8_4_ - auVar92._8_4_;
        ftime.field_0.v[3] = auVar139._12_4_ - auVar92._12_4_;
        itime.field_0.i[0] = (int)auVar92._0_4_;
        itime.field_0.i[1] = (int)auVar92._4_4_;
        itime.field_0.i[2] = (int)auVar92._8_4_;
        itime.field_0.i[3] = (int)auVar92._12_4_;
        uVar111 = uVar21 & 0x7fff;
        uVar113 = uVar22 & 0x7fff;
        uVar110 = *(uint *)(local_c00 + 4 + local_c08);
        uVar62 = (ulong)uVar110;
        uVar55 = (ulong)(uVar110 * uVar113 + *(int *)(local_c00 + local_c08) + uVar111);
        lVar29 = *(long *)&pGVar24[2].numPrimitives;
        lVar58 = (long)itime.field_0.i[k] * 0x38;
        lVar25 = *(long *)(lVar29 + 0x10 + lVar58);
        lVar26 = *(long *)(lVar29 + lVar58);
        pfVar16 = (float *)(lVar26 + lVar25 * uVar55);
        lVar27 = *(long *)(lVar29 + 0x38 + lVar58);
        lVar58 = *(long *)(lVar29 + 0x48 + lVar58);
        pfVar17 = (float *)(lVar27 + lVar58 * uVar55);
        pfVar1 = (float *)(lVar26 + (uVar55 + 1) * lVar25);
        pfVar2 = (float *)(lVar27 + lVar58 * (uVar55 + 1));
        lVar29 = uVar55 + uVar62;
        pfVar3 = (float *)(lVar26 + lVar29 * lVar25);
        pfVar4 = (float *)(lVar27 + lVar58 * lVar29);
        lVar63 = uVar55 + uVar62 + 1;
        pfVar5 = (float *)(lVar26 + lVar63 * lVar25);
        pfVar6 = (float *)(lVar27 + lVar58 * lVar63);
        uVar59 = (ulong)(-1 < (short)uVar21);
        lVar54 = uVar55 + uVar59 + 1;
        pfVar7 = (float *)(lVar26 + lVar54 * lVar25);
        pfVar8 = (float *)(lVar27 + lVar58 * lVar54);
        lVar54 = uVar59 + lVar63;
        pfVar9 = (float *)(lVar26 + lVar54 * lVar25);
        pfVar10 = (float *)(lVar27 + lVar58 * lVar54);
        uVar55 = 0;
        if (-1 < (short)uVar22) {
          uVar55 = uVar62;
        }
        pfVar11 = (float *)(lVar26 + (lVar29 + uVar55) * lVar25);
        pfVar12 = (float *)(lVar27 + lVar58 * (lVar29 + uVar55));
        pfVar13 = (float *)(lVar26 + (lVar63 + uVar55) * lVar25);
        local_8b8 = *(float *)((long)&stack[-2].ptr + k * 4);
        pfVar14 = (float *)(lVar27 + lVar58 * (lVar63 + uVar55));
        fVar216 = (*pfVar2 - *pfVar1) * local_8b8 + *pfVar1;
        local_938 = (pfVar2[1] - pfVar1[1]) * local_8b8 + pfVar1[1];
        local_aa8 = (pfVar2[2] - pfVar1[2]) * local_8b8 + pfVar1[2];
        fVar221 = (*pfVar4 - *pfVar3) * local_8b8 + *pfVar3;
        local_948 = (pfVar4[1] - pfVar3[1]) * local_8b8 + pfVar3[1];
        local_928 = (pfVar4[2] - pfVar3[2]) * local_8b8 + pfVar3[2];
        fVar207 = (*pfVar6 - *pfVar5) * local_8b8 + *pfVar5;
        fVar211 = (pfVar6[1] - pfVar5[1]) * local_8b8 + pfVar5[1];
        fVar212 = (pfVar6[2] - pfVar5[2]) * local_8b8 + pfVar5[2];
        fVar197 = (pfVar6[3] - pfVar5[3]) * local_8b8 + pfVar5[3];
        fStack_934 = (pfVar8[1] - pfVar7[1]) * local_8b8 + pfVar7[1];
        fStack_aa4 = (pfVar8[2] - pfVar7[2]) * local_8b8 + pfVar7[2];
        local_8a8 = (*pfVar10 - *pfVar9) * local_8b8 + *pfVar9;
        fStack_8a4 = (pfVar10[1] - pfVar9[1]) * local_8b8 + pfVar9[1];
        fStack_8a0 = (pfVar10[2] - pfVar9[2]) * local_8b8 + pfVar9[2];
        fStack_884 = (*pfVar12 - *pfVar11) * local_8b8 + *pfVar11;
        fStack_93c = (pfVar12[1] - pfVar11[1]) * local_8b8 + pfVar11[1];
        fStack_91c = (pfVar12[2] - pfVar11[2]) * local_8b8 + pfVar11[2];
        fStack_8b4 = local_8b8;
        fStack_8b0 = local_8b8;
        fStack_8ac = local_8b8;
        local_8c8 = (*pfVar14 - *pfVar13) * local_8b8 + *pfVar13;
        fStack_8c4 = (pfVar14[1] - pfVar13[1]) * local_8b8 + pfVar13[1];
        fStack_8c0 = (pfVar14[2] - pfVar13[2]) * local_8b8 + pfVar13[2];
        fStack_89c = (pfVar10[3] - pfVar9[3]) * local_8b8 + pfVar9[3];
        fStack_8bc = (pfVar14[3] - pfVar13[3]) * local_8b8 + pfVar13[3];
        fVar90 = *(float *)(ray + k * 4);
        fVar172 = ((*pfVar17 - *pfVar16) * local_8b8 + *pfVar16) - fVar90;
        fVar183 = fVar216 - fVar90;
        fVar190 = fVar207 - fVar90;
        fVar194 = fVar221 - fVar90;
        fVar216 = fVar216 - fVar90;
        fVar132 = ((*pfVar8 - *pfVar7) * local_8b8 + *pfVar7) - fVar90;
        fVar134 = local_8a8 - fVar90;
        fVar136 = fVar207 - fVar90;
        local_898 = CONCAT44(fVar207,fVar221);
        local_888 = local_8c8;
        fVar221 = fVar221 - fVar90;
        fVar144 = fVar207 - fVar90;
        fVar155 = local_8c8 - fVar90;
        fVar90 = fStack_884 - fVar90;
        local_a68 = *(float *)(ray + k * 4 + 0x10);
        local_a78 = *(float *)(ray + k * 4 + 0x20);
        local_808 = ((pfVar17[1] - pfVar16[1]) * local_8b8 + pfVar16[1]) - local_a68;
        fStack_804 = local_938 - local_a68;
        fStack_800 = fVar211 - local_a68;
        fStack_7fc = local_948 - local_a68;
        fVar145 = ((pfVar17[2] - pfVar16[2]) * local_8b8 + pfVar16[2]) - local_a78;
        fVar153 = local_aa8 - local_a78;
        fVar204 = fVar212 - local_a78;
        fVar91 = local_928 - local_a78;
        fStack_944 = fVar211;
        fStack_940 = fStack_8c4;
        local_c48 = local_948 - local_a68;
        fStack_c44 = fVar211 - local_a68;
        fStack_c40 = fStack_8c4 - local_a68;
        fStack_c3c = fStack_93c - local_a68;
        fStack_924 = fVar212;
        fStack_920 = fStack_8c0;
        local_a58 = local_928 - local_a78;
        fStack_a54 = fVar212 - local_a78;
        fStack_a50 = fStack_8c0 - local_a78;
        fStack_a4c = fStack_91c - local_a78;
        local_818 = fVar221 - fVar172;
        fStack_814 = fVar144 - fVar183;
        fStack_810 = fVar155 - fVar190;
        fStack_80c = fVar90 - fVar194;
        local_838 = local_c48 - local_808;
        fStack_834 = fStack_c44 - fStack_804;
        fStack_830 = fStack_c40 - fStack_800;
        fStack_82c = fStack_c3c - fStack_7fc;
        local_828 = local_a58 - fVar145;
        fStack_824 = fStack_a54 - fVar153;
        fStack_820 = fStack_a50 - fVar204;
        fStack_81c = fStack_a4c - fVar91;
        local_d28._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
        fVar114 = *(float *)(ray + k * 4 + 0x60);
        fStack_cf4 = *(float *)(ray + k * 4 + 0x40);
        fVar173 = (local_838 * (local_a58 + fVar145) - (local_c48 + local_808) * local_828) *
                  fStack_cf4 +
                  ((fVar221 + fVar172) * local_828 - (local_a58 + fVar145) * local_818) *
                  (float)local_d28._4_4_ +
                  (local_818 * (local_c48 + local_808) - (fVar221 + fVar172) * local_838) * fVar114;
        fVar181 = (fStack_834 * (fStack_a54 + fVar153) - (fStack_c44 + fStack_804) * fStack_824) *
                  fStack_cf4 +
                  ((fVar144 + fVar183) * fStack_824 - (fStack_a54 + fVar153) * fStack_814) *
                  (float)local_d28._4_4_ +
                  (fStack_814 * (fStack_c44 + fStack_804) - (fVar144 + fVar183) * fStack_834) *
                  fVar114;
        local_878._0_8_ = CONCAT44(fVar181,fVar173);
        local_878._8_4_ =
             (fStack_830 * (fStack_a50 + fVar204) - (fStack_c40 + fStack_800) * fStack_820) *
             fStack_cf4 +
             ((fVar155 + fVar190) * fStack_820 - (fStack_a50 + fVar204) * fStack_810) *
             (float)local_d28._4_4_ +
             (fStack_810 * (fStack_c40 + fStack_800) - (fVar155 + fVar190) * fStack_830) * fVar114;
        local_878._12_4_ =
             (fStack_82c * (fStack_a4c + fVar91) - (fStack_c3c + fStack_7fc) * fStack_81c) *
             fStack_cf4 +
             ((fVar90 + fVar194) * fStack_81c - (fStack_a4c + fVar91) * fStack_80c) *
             (float)local_d28._4_4_ +
             (fStack_80c * (fStack_c3c + fStack_7fc) - (fVar90 + fVar194) * fStack_82c) * fVar114;
        fStack_930 = fStack_8a4;
        fStack_92c = fVar211;
        fStack_a64 = local_a68;
        fStack_a60 = local_a68;
        fStack_a5c = local_a68;
        local_ab8 = local_938 - local_a68;
        fStack_ab4 = fStack_934 - local_a68;
        fStack_ab0 = fStack_8a4 - local_a68;
        fStack_aac = fVar211 - local_a68;
        local_918 = CONCAT44(fStack_aa4,local_aa8);
        local_908 = fStack_8a0;
        fStack_904 = fVar212;
        fStack_a74 = local_a78;
        fStack_a70 = local_a78;
        fStack_a6c = local_a78;
        local_aa8 = local_aa8 - local_a78;
        fStack_aa4 = fStack_aa4 - local_a78;
        fStack_aa0 = fStack_8a0 - local_a78;
        fStack_a9c = fVar212 - local_a78;
        fVar188 = fVar172 - fVar216;
        fVar170 = fVar183 - fVar132;
        fVar201 = fVar190 - fVar134;
        fVar205 = fVar194 - fVar136;
        fVar180 = local_808 - local_ab8;
        fVar189 = fStack_804 - fStack_ab4;
        fVar191 = fStack_800 - fStack_ab0;
        fVar195 = fStack_7fc - fStack_aac;
        local_848 = fVar145 - local_aa8;
        fStack_844 = fVar153 - fStack_aa4;
        fStack_840 = fVar204 - fStack_aa0;
        fStack_83c = fVar91 - fStack_a9c;
        local_868._0_4_ =
             (fVar180 * (fVar145 + local_aa8) - (local_808 + local_ab8) * local_848) * fStack_cf4 +
             ((fVar172 + fVar216) * local_848 - (fVar145 + local_aa8) * fVar188) *
             (float)local_d28._4_4_ +
             (fVar188 * (local_808 + local_ab8) - (fVar172 + fVar216) * fVar180) * fVar114;
        local_868._4_4_ =
             (fVar189 * (fVar153 + fStack_aa4) - (fStack_804 + fStack_ab4) * fStack_844) *
             fStack_cf4 +
             ((fVar183 + fVar132) * fStack_844 - (fVar153 + fStack_aa4) * fVar170) *
             (float)local_d28._4_4_ +
             (fVar170 * (fStack_804 + fStack_ab4) - (fVar183 + fVar132) * fVar189) * fVar114;
        local_868._8_4_ =
             (fVar191 * (fVar204 + fStack_aa0) - (fStack_800 + fStack_ab0) * fStack_840) *
             fStack_cf4 +
             ((fVar190 + fVar134) * fStack_840 - (fVar204 + fStack_aa0) * fVar201) *
             (float)local_d28._4_4_ +
             (fVar201 * (fStack_800 + fStack_ab0) - (fVar190 + fVar134) * fVar191) * fVar114;
        local_868._12_4_ =
             (fVar195 * (fVar91 + fStack_a9c) - (fStack_7fc + fStack_aac) * fStack_83c) * fStack_cf4
             + ((fVar194 + fVar136) * fStack_83c - (fVar91 + fStack_a9c) * fVar205) *
               (float)local_d28._4_4_ +
               (fVar205 * (fStack_7fc + fStack_aac) - (fVar194 + fVar136) * fVar195) * fVar114;
        fVar112 = fVar216 - fVar221;
        fVar171 = fVar132 - fVar144;
        fVar179 = fVar134 - fVar155;
        fVar182 = fVar136 - fVar90;
        fVar202 = local_ab8 - local_c48;
        fVar152 = fStack_ab4 - fStack_c44;
        fVar154 = fStack_ab0 - fStack_c40;
        fVar185 = fStack_aac - fStack_c3c;
        fVar156 = local_aa8 - local_a58;
        fVar166 = fStack_aa4 - fStack_a54;
        fVar184 = fStack_aa0 - fStack_a50;
        fVar186 = fStack_a9c - fStack_a4c;
        local_a98 = local_ab8 + local_c48;
        fStack_a94 = fStack_ab4 + fStack_c44;
        fStack_a90 = fStack_ab0 + fStack_c40;
        fStack_a8c = fStack_aac + fStack_c3c;
        local_a88 = local_aa8 + local_a58;
        fStack_a84 = fStack_aa4 + fStack_a54;
        fStack_a80 = fStack_aa0 + fStack_a50;
        fStack_a7c = fStack_a9c + fStack_a4c;
        auVar217._8_4_ = local_878._8_4_;
        auVar217._0_8_ = local_878._0_8_;
        auVar217._12_4_ = local_878._12_4_;
        local_d28._0_4_ = local_d28._4_4_;
        fStack_d20 = (float)local_d28._4_4_;
        fStack_d1c = (float)local_d28._4_4_;
        old_t_1 = fStack_cf4;
        uStack_cf0._0_4_ = fStack_cf4;
        uStack_cf0._4_4_ = fStack_cf4;
        auVar97._0_4_ =
             (fVar202 * local_a88 - local_a98 * fVar156) * fStack_cf4 +
             ((fVar221 + fVar216) * fVar156 - fVar112 * local_a88) * (float)local_d28._4_4_ +
             (fVar112 * local_a98 - (fVar221 + fVar216) * fVar202) * fVar114;
        auVar97._4_4_ =
             (fVar152 * fStack_a84 - fStack_a94 * fVar166) * fStack_cf4 +
             ((fVar144 + fVar132) * fVar166 - fVar171 * fStack_a84) * (float)local_d28._4_4_ +
             (fVar171 * fStack_a94 - (fVar144 + fVar132) * fVar152) * fVar114;
        auVar97._8_4_ =
             (fVar154 * fStack_a80 - fStack_a90 * fVar184) * fStack_cf4 +
             ((fVar155 + fVar134) * fVar184 - fVar179 * fStack_a80) * (float)local_d28._4_4_ +
             (fVar179 * fStack_a90 - (fVar155 + fVar134) * fVar154) * fVar114;
        auVar97._12_4_ =
             (fVar185 * fStack_a7c - fStack_a8c * fVar186) * fStack_cf4 +
             ((fVar90 + fVar136) * fVar186 - fVar182 * fStack_a7c) * (float)local_d28._4_4_ +
             (fVar182 * fStack_a8c - (fVar90 + fVar136) * fVar185) * fVar114;
        local_858 = fVar173 + local_868._0_4_ + auVar97._0_4_;
        fStack_854 = fVar181 + local_868._4_4_ + auVar97._4_4_;
        fStack_850 = local_878._8_4_ + local_868._8_4_ + auVar97._8_4_;
        fStack_84c = local_878._12_4_ + local_868._12_4_ + auVar97._12_4_;
        auVar70._8_4_ = local_878._8_4_;
        auVar70._0_8_ = local_878._0_8_;
        auVar70._12_4_ = local_878._12_4_;
        auVar92 = minps(auVar70,local_868);
        auVar92 = minps(auVar92,auVar97);
        auVar115 = maxps(auVar217,local_868);
        auVar115 = maxps(auVar115,auVar97);
        fVar90 = ABS(local_858) * 1.1920929e-07;
        fVar221 = ABS(fStack_854) * 1.1920929e-07;
        fVar144 = ABS(fStack_850) * 1.1920929e-07;
        fVar155 = ABS(fStack_84c) * 1.1920929e-07;
        auVar218._4_4_ = -(uint)(auVar115._4_4_ <= fVar221);
        auVar218._0_4_ = -(uint)(auVar115._0_4_ <= fVar90);
        auVar218._8_4_ = -(uint)(auVar115._8_4_ <= fVar144);
        auVar218._12_4_ = -(uint)(auVar115._12_4_ <= fVar155);
        auVar71._4_4_ = -(uint)(-fVar221 <= auVar92._4_4_);
        auVar71._0_4_ = -(uint)(-fVar90 <= auVar92._0_4_);
        auVar71._8_4_ = -(uint)(-fVar144 <= auVar92._8_4_);
        auVar71._12_4_ = -(uint)(-fVar155 <= auVar92._12_4_);
        auVar218 = auVar218 | auVar71;
        lVar58 = (uVar55 + lVar54) * lVar58;
        uVar110 = movmskps((int)lVar58,auVar218);
        pSVar51 = (Scene *)(ulong)uVar110;
        puVar15 = (undefined8 *)(lVar26 + lVar25 * (uVar55 + lVar54));
        uVar44 = *puVar15;
        uVar45 = puVar15[1];
        _local_c28 = *(undefined1 (*) [16])(lVar27 + lVar58);
        if (uVar110 == 0) {
          auVar158._4_4_ = fVar211;
          auVar158._0_4_ = fVar207;
          auVar158._8_4_ = fVar212;
          goto LAB_0073e3a0;
        }
        auVar149._0_4_ = local_838 * local_848 - fVar180 * local_828;
        auVar149._4_4_ = fStack_834 * fStack_844 - fVar189 * fStack_824;
        auVar149._8_4_ = fStack_830 * fStack_840 - fVar191 * fStack_820;
        auVar149._12_4_ = fStack_82c * fStack_83c - fVar195 * fStack_81c;
        auVar228._0_4_ = fVar180 * fVar156 - fVar202 * local_848;
        auVar228._4_4_ = fVar189 * fVar166 - fVar152 * fStack_844;
        auVar228._8_4_ = fVar191 * fVar184 - fVar154 * fStack_840;
        auVar228._12_4_ = fVar195 * fVar186 - fVar185 * fStack_83c;
        auVar72._4_4_ = -(uint)(ABS(fVar189 * fStack_824) < ABS(fVar152 * fStack_844));
        auVar72._0_4_ = -(uint)(ABS(fVar180 * local_828) < ABS(fVar202 * local_848));
        auVar72._8_4_ = -(uint)(ABS(fVar191 * fStack_820) < ABS(fVar154 * fStack_840));
        auVar72._12_4_ = -(uint)(ABS(fVar195 * fStack_81c) < ABS(fVar185 * fStack_83c));
        local_ae8 = blendvps(auVar228,auVar149,auVar72);
        auVar214._0_4_ = fVar112 * local_848 - fVar188 * fVar156;
        auVar214._4_4_ = fVar171 * fStack_844 - fVar170 * fVar166;
        auVar214._8_4_ = fVar179 * fStack_840 - fVar201 * fVar184;
        auVar214._12_4_ = fVar182 * fStack_83c - fVar205 * fVar186;
        auVar73._4_4_ = -(uint)(ABS(fStack_814 * fStack_844) < ABS(fVar170 * fVar166));
        auVar73._0_4_ = -(uint)(ABS(local_818 * local_848) < ABS(fVar188 * fVar156));
        auVar73._8_4_ = -(uint)(ABS(fStack_810 * fStack_840) < ABS(fVar201 * fVar184));
        auVar73._12_4_ = -(uint)(ABS(fStack_80c * fStack_83c) < ABS(fVar205 * fVar186));
        auVar42._4_4_ = fStack_824 * fVar170 - fStack_814 * fStack_844;
        auVar42._0_4_ = local_828 * fVar188 - local_818 * local_848;
        auVar42._8_4_ = fStack_820 * fVar201 - fStack_810 * fStack_840;
        auVar42._12_4_ = fStack_81c * fVar205 - fStack_80c * fStack_83c;
        local_ad8 = blendvps(auVar214,auVar42,auVar73);
        auVar140._0_4_ = local_818 * fVar180 - fVar188 * local_838;
        auVar140._4_4_ = fStack_814 * fVar189 - fVar170 * fStack_834;
        auVar140._8_4_ = fStack_810 * fVar191 - fVar201 * fStack_830;
        auVar140._12_4_ = fStack_80c * fVar195 - fVar205 * fStack_82c;
        auVar193._0_4_ = fVar188 * fVar202 - fVar112 * fVar180;
        auVar193._4_4_ = fVar170 * fVar152 - fVar171 * fVar189;
        auVar193._8_4_ = fVar201 * fVar154 - fVar179 * fVar191;
        auVar193._12_4_ = fVar205 * fVar185 - fVar182 * fVar195;
        auVar74._4_4_ = -(uint)(ABS(fVar170 * fStack_834) < ABS(fVar171 * fVar189));
        auVar74._0_4_ = -(uint)(ABS(fVar188 * local_838) < ABS(fVar112 * fVar180));
        auVar74._8_4_ = -(uint)(ABS(fVar201 * fStack_830) < ABS(fVar179 * fVar191));
        auVar74._12_4_ = -(uint)(ABS(fVar205 * fStack_82c) < ABS(fVar182 * fVar195));
        local_ac8 = blendvps(auVar193,auVar140,auVar74);
        fVar90 = fStack_cf4 * local_ae8._0_4_ +
                 (float)local_d28._4_4_ * local_ad8._0_4_ + fVar114 * local_ac8._0_4_;
        fVar221 = fStack_cf4 * local_ae8._4_4_ +
                  (float)local_d28._4_4_ * local_ad8._4_4_ + fVar114 * local_ac8._4_4_;
        fVar144 = fStack_cf4 * local_ae8._8_4_ +
                  (float)local_d28._4_4_ * local_ad8._8_4_ + fVar114 * local_ac8._8_4_;
        fVar155 = fStack_cf4 * local_ae8._12_4_ +
                  (float)local_d28._4_4_ * local_ad8._12_4_ + fVar114 * local_ac8._12_4_;
        auVar75._0_4_ = fVar90 + fVar90;
        auVar75._4_4_ = fVar221 + fVar221;
        auVar75._8_4_ = fVar144 + fVar144;
        auVar75._12_4_ = fVar155 + fVar155;
        auVar118._0_4_ = local_808 * local_ad8._0_4_ + fVar145 * local_ac8._0_4_;
        auVar118._4_4_ = fStack_804 * local_ad8._4_4_ + fVar153 * local_ac8._4_4_;
        auVar118._8_4_ = fStack_800 * local_ad8._8_4_ + fVar204 * local_ac8._8_4_;
        auVar118._12_4_ = fStack_7fc * local_ad8._12_4_ + fVar91 * local_ac8._12_4_;
        fVar216 = fVar172 * local_ae8._0_4_ + auVar118._0_4_;
        fVar132 = fVar183 * local_ae8._4_4_ + auVar118._4_4_;
        fVar134 = fVar190 * local_ae8._8_4_ + auVar118._8_4_;
        fVar136 = fVar194 * local_ae8._12_4_ + auVar118._12_4_;
        auVar92 = rcpps(auVar118,auVar75);
        fVar90 = auVar92._0_4_;
        fVar221 = auVar92._4_4_;
        fVar144 = auVar92._8_4_;
        fVar155 = auVar92._12_4_;
        local_af8._0_4_ = ((1.0 - auVar75._0_4_ * fVar90) * fVar90 + fVar90) * (fVar216 + fVar216);
        local_af8._4_4_ =
             ((1.0 - auVar75._4_4_ * fVar221) * fVar221 + fVar221) * (fVar132 + fVar132);
        local_af8._8_4_ =
             ((1.0 - auVar75._8_4_ * fVar144) * fVar144 + fVar144) * (fVar134 + fVar134);
        local_af8._12_4_ =
             ((1.0 - auVar75._12_4_ * fVar155) * fVar155 + fVar155) * (fVar136 + fVar136);
        fVar90 = *(float *)(ray + k * 4 + 0x80);
        fVar221 = *(float *)(ray + k * 4 + 0x30);
        auVar119._0_4_ =
             -(uint)(local_af8._0_4_ <= fVar90 && fVar221 <= local_af8._0_4_) & auVar218._0_4_;
        auVar119._4_4_ =
             -(uint)(local_af8._4_4_ <= fVar90 && fVar221 <= local_af8._4_4_) & auVar218._4_4_;
        auVar119._8_4_ =
             -(uint)(local_af8._8_4_ <= fVar90 && fVar221 <= local_af8._8_4_) & auVar218._8_4_;
        auVar119._12_4_ =
             -(uint)(local_af8._12_4_ <= fVar90 && fVar221 <= local_af8._12_4_) & auVar218._12_4_;
        iVar48 = movmskps(uVar110,auVar119);
        if (iVar48 != 0) {
          auVar120._0_4_ = auVar119._0_4_ & -(uint)(auVar75._0_4_ != 0.0);
          auVar120._4_4_ = auVar119._4_4_ & -(uint)(auVar75._4_4_ != 0.0);
          auVar120._8_4_ = auVar119._8_4_ & -(uint)(auVar75._8_4_ != 0.0);
          auVar120._12_4_ = auVar119._12_4_ & -(uint)(auVar75._12_4_ != 0.0);
          uVar110 = movmskps(iVar48,auVar120);
          if (uVar110 == 0) goto LAB_0073e2de;
          auVar46._4_4_ = fStack_854;
          auVar46._0_4_ = local_858;
          auVar46._8_4_ = fStack_850;
          auVar46._12_4_ = fStack_84c;
          auVar98._4_12_ = local_af8._4_12_;
          auVar98._0_4_ = (float)(int)(*(ushort *)(local_c00 + 8 + local_c08) - 1);
          auVar141._4_4_ = local_af8._4_4_;
          auVar141._0_4_ = auVar98._0_4_;
          auVar141._8_4_ = local_af8._8_4_;
          auVar141._12_4_ = local_af8._12_4_;
          auVar92 = rcpss(auVar141,auVar98);
          auVar150._0_4_ = (float)(int)(*(ushort *)(local_c00 + 10 + local_c08) - 1);
          auVar150._4_12_ = local_d28._4_12_;
          fVar221 = (2.0 - auVar98._0_4_ * auVar92._0_4_) * auVar92._0_4_;
          auVar142._4_4_ = local_d28._4_4_;
          auVar142._0_4_ = auVar150._0_4_;
          auVar142._8_4_ = local_d28._4_4_;
          auVar142._12_4_ = local_d28._4_4_;
          auVar92 = rcpss(auVar142,auVar150);
          fVar144 = (2.0 - auVar150._0_4_ * auVar92._0_4_) * auVar92._0_4_;
          auVar121._0_4_ = (float)uVar113 * local_858 + local_868._0_4_;
          auVar121._4_4_ = (float)uVar113 * fStack_854 + local_868._4_4_;
          auVar121._8_4_ = (float)(uVar113 + 1) * fStack_850 + local_868._8_4_;
          auVar121._12_4_ = (float)(uVar113 + 1) * fStack_84c + local_868._12_4_;
          pGVar24 = (pSVar23->geometries).items[uVar52].ptr;
          auVar158._4_4_ = fVar211;
          auVar158._0_4_ = fVar207;
          auVar158._8_4_ = fVar212;
          auVar161._12_4_ = fVar197;
          auVar161._0_12_ = auVar158;
          pSVar51 = pSVar23;
          if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0073e3a0;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar92 = rcpps(auVar121,auVar46);
            fVar114 = auVar92._0_4_;
            fVar155 = auVar92._4_4_;
            fVar216 = auVar92._8_4_;
            fVar132 = auVar92._12_4_;
            fVar114 = (float)(-(uint)(1e-18 <= ABS(local_858)) &
                             (uint)(((float)DAT_01f46a60 - local_858 * fVar114) * fVar114 + fVar114)
                             );
            fVar155 = (float)(-(uint)(1e-18 <= ABS(fStack_854)) &
                             (uint)((DAT_01f46a60._4_4_ - fStack_854 * fVar155) * fVar155 + fVar155)
                             );
            fVar216 = (float)(-(uint)(1e-18 <= ABS(fStack_850)) &
                             (uint)((DAT_01f46a60._8_4_ - fStack_850 * fVar216) * fVar216 + fVar216)
                             );
            fVar132 = (float)(-(uint)(1e-18 <= ABS(fStack_84c)) &
                             (uint)((DAT_01f46a60._12_4_ - fStack_84c * fVar132) * fVar132 + fVar132
                                   ));
            auVar76._0_4_ = fVar221 * (fVar173 + (float)uVar111 * local_858) * fVar114;
            auVar76._4_4_ = fVar221 * (fVar181 + (float)(uVar111 + 1) * fStack_854) * fVar155;
            auVar76._8_4_ =
                 fVar221 * (local_878._8_4_ + (float)(uVar111 + 1) * fStack_850) * fVar216;
            auVar76._12_4_ = fVar221 * (local_878._12_4_ + (float)uVar111 * fStack_84c) * fVar132;
            local_b18 = minps(auVar76,_DAT_01f46a60);
            auVar99._0_4_ = fVar144 * auVar121._0_4_ * fVar114;
            auVar99._4_4_ = fVar144 * auVar121._4_4_ * fVar155;
            auVar99._8_4_ = fVar144 * auVar121._8_4_ * fVar216;
            auVar99._12_4_ = fVar144 * auVar121._12_4_ * fVar132;
            local_b08 = minps(auVar99,_DAT_01f46a60);
            local_c78 = (byte)uVar110;
            uVar55 = (ulong)local_c78;
            local_d38 = (Scene *)0x0;
            if (uVar55 != 0) {
              for (; (local_c78 >> (long)local_d38 & 1) == 0;
                  local_d38 = (Scene *)((long)&(local_d38->super_AccelN).super_Accel.super_AccelData
                                               .super_RefCount._vptr_RefCount + 1)) {
              }
            }
            _old_t_1 = CONCAT44(uVar52,uVar52);
            uStack_cf0._0_4_ = (float)uVar52;
            uStack_cf0._4_4_ = (float)uVar52;
            auVar47 = *(undefined1 (*) [12])
                       &(local_c10->super_AccelN).super_Accel.super_AccelData.super_RefCount;
            uStack_c8c = (undefined4)
                         ((local_c10->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                          refCounter.super___atomic_base<unsigned_long>._M_i >> 0x20);
            pSVar51 = local_c10;
            while( true ) {
              auVar158 = auVar161._0_12_;
              if (uVar55 == 0) break;
              local_9a8 = *(undefined4 *)(local_b18 + (long)local_d38 * 4);
              local_998._4_4_ = *(undefined4 *)(local_b08 + (long)local_d38 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_af8 + (long)local_d38 * 4)
              ;
              args.context = context->user;
              local_9d8 = *(undefined4 *)(local_ae8 + (long)local_d38 * 4);
              local_9c8._4_4_ = *(undefined4 *)(local_ad8 + (long)local_d38 * 4);
              local_9b8._4_4_ = *(undefined4 *)(local_ac8 + (long)local_d38 * 4);
              uStack_9d4 = local_9d8;
              uStack_9d0 = local_9d8;
              uStack_9cc = local_9d8;
              local_9c8._0_4_ = local_9c8._4_4_;
              local_9c8._8_4_ = local_9c8._4_4_;
              local_9c8._12_4_ = local_9c8._4_4_;
              local_9b8._0_4_ = local_9b8._4_4_;
              local_9b8._8_4_ = local_9b8._4_4_;
              local_9b8._12_4_ = local_9b8._4_4_;
              uStack_9a4 = local_9a8;
              uStack_9a0 = local_9a8;
              uStack_99c = local_9a8;
              local_998._0_4_ = local_998._4_4_;
              local_998._8_4_ = local_998._4_4_;
              local_998._12_4_ = local_998._4_4_;
              local_988 = CONCAT44(uVar109,uVar109);
              uStack_980 = CONCAT44(uVar109,uVar109);
              local_978 = _old_t_1;
              uStack_970 = uStack_cf0;
              local_968 = (args.context)->instID[0];
              uStack_964 = local_968;
              uStack_960 = local_968;
              uStack_95c = local_968;
              local_958 = (args.context)->instPrimID[0];
              uStack_954 = local_958;
              uStack_950 = local_958;
              uStack_94c = local_958;
              local_c38.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_ = uStack_c8c;
              local_c38._0_12_ = auVar47;
              args.valid = (int *)&local_c38;
              args.geometryUserPtr = pGVar24->userPtr;
              args.hit = (RTCHitN *)&local_9d8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar24->occlusionFilterN)(&args);
                auVar161._4_4_ = fVar211;
                auVar161._0_4_ = fVar207;
                auVar161._8_4_ = fVar212;
              }
              if (local_c38 == (RefCount)0x0) {
                auVar100._8_4_ = 0xffffffff;
                auVar100._0_8_ = 0xffffffffffffffff;
                auVar100._12_4_ = 0xffffffff;
                auVar100 = auVar100 ^ _DAT_01f46b70;
              }
              else {
                p_Var28 = context->args->filter;
                if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar24->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var28)(&args);
                  auVar161._4_4_ = fVar211;
                  auVar161._0_4_ = fVar207;
                  auVar161._8_4_ = fVar212;
                }
                auVar77._0_4_ = -(uint)((int)local_c38._vptr_RefCount == 0);
                auVar77._4_4_ = -(uint)(local_c38._vptr_RefCount._4_4_ == 0);
                auVar77._8_4_ =
                     -(uint)((int)local_c38.refCounter.super___atomic_base<unsigned_long>._M_i == 0)
                ;
                auVar77._12_4_ =
                     -(uint)(local_c38.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_ == 0
                            );
                auVar100 = auVar77 ^ _DAT_01f46b70;
                auVar92 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar77);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar92;
              }
              if ((_DAT_01f46b40 & auVar100) != (undefined1  [16])0x0) goto LAB_0073ecd9;
              *(float *)(ray + k * 4 + 0x80) = fVar90;
              uVar55 = uVar55 ^ 1L << ((ulong)local_d38 & 0x3f);
              pSVar51 = (Scene *)0x0;
              local_d38 = pSVar51;
              if (uVar55 != 0) {
                for (; local_d38 = pSVar51, (uVar55 >> (long)pSVar51 & 1) == 0;
                    pSVar51 = (Scene *)((long)&(pSVar51->super_AccelN).super_Accel.super_AccelData.
                                               super_RefCount._vptr_RefCount + 1)) {
                }
              }
            }
            local_a68 = *(float *)(ray + k * 4 + 0x10);
            local_a78 = *(float *)(ray + k * 4 + 0x20);
            fStack_cf4 = *(float *)(ray + k * 4 + 0x40);
            uVar57 = *(undefined4 *)(ray + k * 4 + 0x50);
            old_t_1 = fStack_cf4;
            uStack_cf0._0_4_ = fStack_cf4;
            uStack_cf0._4_4_ = fStack_cf4;
            local_d28._4_4_ = uVar57;
            local_d28._0_4_ = uVar57;
            fStack_d20 = (float)uVar57;
            fStack_d1c = (float)uVar57;
            fVar114 = *(float *)(ray + k * 4 + 0x60);
            local_c48 = local_948 - local_a68;
            fStack_c44 = fStack_944 - local_a68;
            fStack_c40 = fStack_940 - local_a68;
            fStack_c3c = fStack_93c - local_a68;
            fStack_a64 = local_a68;
            fStack_a60 = local_a68;
            fStack_a5c = local_a68;
            fStack_a74 = local_a78;
            fStack_a70 = local_a78;
            fStack_a6c = local_a78;
            local_a98 = local_c48 + (local_938 - local_a68);
            fStack_a94 = fStack_c44 + (fStack_934 - local_a68);
            fStack_a90 = fStack_c40 + (fStack_930 - local_a68);
            fStack_a8c = fStack_c3c + (fStack_92c - local_a68);
            local_a88 = (local_928 - local_a78) + ((float)local_918 - local_a78);
            fStack_a84 = (fStack_924 - local_a78) + (local_918._4_4_ - local_a78);
            fStack_a80 = (fStack_920 - local_a78) + (fStack_910 - local_a78);
            fStack_a7c = (fStack_91c - local_a78) + (fStack_90c - local_a78);
            local_aa8 = (float)local_918 - local_a78;
            fStack_aa4 = local_918._4_4_ - local_a78;
            fStack_aa0 = fStack_910 - local_a78;
            fStack_a9c = fStack_90c - local_a78;
            local_ab8 = local_938 - local_a68;
            fStack_ab4 = fStack_934 - local_a68;
            fStack_ab0 = fStack_930 - local_a68;
            fStack_aac = fStack_92c - local_a68;
            local_a58 = local_928 - local_a78;
            fStack_a54 = fStack_924 - local_a78;
            fStack_a50 = fStack_920 - local_a78;
            fStack_a4c = fStack_91c - local_a78;
            goto LAB_0073e3a0;
          }
LAB_0073ecd9:
          *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
          goto LAB_0073eced;
        }
        uVar110 = 0;
LAB_0073e2de:
        pSVar51 = (Scene *)(ulong)uVar110;
        auVar158._4_4_ = fVar211;
        auVar158._0_4_ = fVar207;
        auVar158._8_4_ = fVar212;
LAB_0073e3a0:
        local_cb8._0_4_ = (float)uVar44;
        local_cb8._4_4_ = (float)((ulong)uVar44 >> 0x20);
        uStack_cb0._0_4_ = (float)uVar45;
        fVar201 = auVar158._8_4_ - fStack_a6c;
        fVar205 = fStack_8a0 - fStack_a6c;
        fVar207 = (fStack_8b0 * (fStack_c20 - (float)uStack_cb0) + (float)uStack_cb0) - fStack_a6c;
        fVar211 = fStack_8c0 - fStack_a6c;
        fVar222 = auVar158._4_4_ - fStack_a5c;
        fVar223 = fStack_8a4 - fStack_a5c;
        fVar224 = (fStack_8b4 * ((float)local_c28._4_4_ - local_cb8._4_4_) + local_cb8._4_4_) -
                  fStack_a5c;
        fVar225 = fStack_8c4 - fStack_a5c;
        fVar90 = *(float *)(ray + k * 4);
        fVar179 = auVar158._0_4_ - fVar90;
        fVar182 = local_8a8 - fVar90;
        fVar202 = (local_8b8 * ((float)local_c28._0_4_ - (float)local_cb8) + (float)local_cb8) -
                  fVar90;
        fVar152 = local_8c8 - fVar90;
        fVar154 = (float)local_898 - fVar90;
        fVar185 = local_898._4_4_ - fVar90;
        fVar172 = fStack_890 - fVar90;
        fVar180 = fStack_88c - fVar90;
        fVar155 = local_888 - fVar90;
        fVar132 = fStack_884 - fVar90;
        fVar136 = fStack_880 - fVar90;
        fVar90 = fStack_87c - fVar90;
        fVar145 = fVar155 - fVar179;
        fVar153 = fVar132 - fVar182;
        fVar204 = fVar136 - fVar202;
        fVar91 = fVar90 - fVar152;
        fVar226 = local_ab8 - fVar222;
        fVar230 = fStack_ab4 - fVar223;
        fVar232 = fStack_ab0 - fVar224;
        fVar234 = fStack_aac - fVar225;
        fVar183 = local_aa8 - fVar201;
        fVar190 = fStack_aa4 - fVar205;
        fVar194 = fStack_aa0 - fVar207;
        fVar196 = fStack_a9c - fVar211;
        fVar221 = local_c48 - local_ab8;
        fVar144 = fStack_c44 - fStack_ab4;
        fVar216 = fStack_c40 - fStack_ab0;
        fVar134 = fStack_c3c - fStack_aac;
        fVar212 = local_a58 - local_aa8;
        fVar197 = fStack_a54 - fStack_aa4;
        fVar112 = fStack_a50 - fStack_aa0;
        fVar171 = fStack_a4c - fStack_a9c;
        fVar156 = fVar179 - fVar154;
        fVar166 = fVar182 - fVar185;
        fVar184 = fVar202 - fVar172;
        fVar186 = fVar152 - fVar180;
        fVar199 = (fVar226 * (local_aa8 + fVar201) - (local_ab8 + fVar222) * fVar183) * old_t_1 +
                  ((fVar155 + fVar179) * fVar183 - (local_aa8 + fVar201) * fVar145) *
                  (float)local_d28._0_4_ +
                  (fVar145 * (local_ab8 + fVar222) - (fVar155 + fVar179) * fVar226) * fVar114;
        fVar200 = (fVar230 * (fStack_aa4 + fVar205) - (fStack_ab4 + fVar223) * fVar190) * fStack_cf4
                  + ((fVar132 + fVar182) * fVar190 - (fStack_aa4 + fVar205) * fVar153) *
                    (float)local_d28._4_4_ +
                    (fVar153 * (fStack_ab4 + fVar223) - (fVar132 + fVar182) * fVar230) * fVar114;
        fVar203 = (fVar232 * (fStack_aa0 + fVar207) - (fStack_ab0 + fVar224) * fVar194) *
                  (float)uStack_cf0 +
                  ((fVar136 + fVar202) * fVar194 - (fStack_aa0 + fVar207) * fVar204) * fStack_d20 +
                  (fVar204 * (fStack_ab0 + fVar224) - (fVar136 + fVar202) * fVar232) * fVar114;
        fVar220 = (fVar234 * (fStack_a9c + fVar211) - (fStack_aac + fVar225) * fVar196) *
                  uStack_cf0._4_4_ +
                  ((fVar90 + fVar152) * fVar196 - (fStack_a9c + fVar211) * fVar91) * fStack_d1c +
                  (fVar91 * (fStack_aac + fVar225) - (fVar90 + fVar152) * fVar234) * fVar114;
        fVar189 = fVar222 - local_c48;
        fVar191 = fVar223 - fStack_c44;
        fVar195 = fVar224 - fStack_c40;
        fVar198 = fVar225 - fStack_c3c;
        fVar227 = fVar201 - local_a58;
        fVar231 = fVar205 - fStack_a54;
        fVar233 = fVar207 - fStack_a50;
        fVar235 = fVar211 - fStack_a4c;
        auVar162._0_4_ =
             (fVar189 * (local_a58 + fVar201) - (local_c48 + fVar222) * fVar227) * old_t_1 +
             ((fVar179 + fVar154) * fVar227 - (local_a58 + fVar201) * fVar156) *
             (float)local_d28._0_4_ +
             (fVar156 * (local_c48 + fVar222) - (fVar179 + fVar154) * fVar189) * fVar114;
        auVar162._4_4_ =
             (fVar191 * (fStack_a54 + fVar205) - (fStack_c44 + fVar223) * fVar231) * fStack_cf4 +
             ((fVar182 + fVar185) * fVar231 - (fStack_a54 + fVar205) * fVar166) *
             (float)local_d28._4_4_ +
             (fVar166 * (fStack_c44 + fVar223) - (fVar182 + fVar185) * fVar191) * fVar114;
        auVar162._8_4_ =
             (fVar195 * (fStack_a50 + fVar207) - (fStack_c40 + fVar224) * fVar233) *
             (float)uStack_cf0 +
             ((fVar202 + fVar172) * fVar233 - (fStack_a50 + fVar207) * fVar184) * fStack_d20 +
             (fVar184 * (fStack_c40 + fVar224) - (fVar202 + fVar172) * fVar195) * fVar114;
        auVar162._12_4_ =
             (fVar198 * (fStack_a4c + fVar211) - (fStack_c3c + fVar225) * fVar235) *
             uStack_cf0._4_4_ +
             ((fVar152 + fVar180) * fVar235 - (fStack_a4c + fVar211) * fVar186) * fStack_d1c +
             (fVar186 * (fStack_c3c + fVar225) - (fVar152 + fVar180) * fVar198) * fVar114;
        fVar173 = fVar154 - fVar155;
        fVar181 = fVar185 - fVar132;
        fVar188 = fVar172 - fVar136;
        fVar170 = fVar180 - fVar90;
        auVar78._0_4_ =
             (fVar221 * local_a88 - local_a98 * fVar212) * old_t_1 +
             ((fVar155 + fVar154) * fVar212 - local_a88 * fVar173) * (float)local_d28._0_4_ +
             (fVar173 * local_a98 - (fVar155 + fVar154) * fVar221) * fVar114;
        auVar78._4_4_ =
             (fVar144 * fStack_a84 - fStack_a94 * fVar197) * fStack_cf4 +
             ((fVar132 + fVar185) * fVar197 - fStack_a84 * fVar181) * (float)local_d28._4_4_ +
             (fVar181 * fStack_a94 - (fVar132 + fVar185) * fVar144) * fVar114;
        auVar78._8_4_ =
             (fVar216 * fStack_a80 - fStack_a90 * fVar112) * (float)uStack_cf0 +
             ((fVar136 + fVar172) * fVar112 - fStack_a80 * fVar188) * fStack_d20 +
             (fVar188 * fStack_a90 - (fVar136 + fVar172) * fVar216) * fVar114;
        auVar78._12_4_ =
             (fVar134 * fStack_a7c - fStack_a8c * fVar171) * uStack_cf0._4_4_ +
             ((fVar90 + fVar180) * fVar171 - fStack_a7c * fVar170) * fStack_d1c +
             (fVar170 * fStack_a8c - (fVar90 + fVar180) * fVar134) * fVar114;
        local_c28._0_4_ = fVar199 + auVar162._0_4_ + auVar78._0_4_;
        local_c28._4_4_ = fVar200 + auVar162._4_4_ + auVar78._4_4_;
        fStack_c20 = fVar203 + auVar162._8_4_ + auVar78._8_4_;
        register0x0000128c = fVar220 + auVar162._12_4_ + auVar78._12_4_;
        auVar101._8_4_ = fVar203;
        auVar101._0_8_ = CONCAT44(fVar200,fVar199);
        auVar101._12_4_ = fVar220;
        auVar92 = minps(auVar101,auVar162);
        auVar92 = minps(auVar92,auVar78);
        auVar209._8_4_ = fVar203;
        auVar209._0_8_ = CONCAT44(fVar200,fVar199);
        auVar209._12_4_ = fVar220;
        auVar115 = maxps(auVar209,auVar162);
        auVar115 = maxps(auVar115,auVar78);
        fVar90 = ABS((float)local_c28._0_4_) * 1.1920929e-07;
        fVar155 = ABS((float)local_c28._4_4_) * 1.1920929e-07;
        fVar132 = ABS(fStack_c20) * 1.1920929e-07;
        fVar136 = ABS(register0x0000128c) * 1.1920929e-07;
        auVar210._4_4_ = -(uint)(auVar115._4_4_ <= fVar155);
        auVar210._0_4_ = -(uint)(auVar115._0_4_ <= fVar90);
        auVar210._8_4_ = -(uint)(auVar115._8_4_ <= fVar132);
        auVar210._12_4_ = -(uint)(auVar115._12_4_ <= fVar136);
        auVar102._4_4_ = -(uint)(-fVar155 <= auVar92._4_4_);
        auVar102._0_4_ = -(uint)(-fVar90 <= auVar92._0_4_);
        auVar102._8_4_ = -(uint)(-fVar132 <= auVar92._8_4_);
        auVar102._12_4_ = -(uint)(-fVar136 <= auVar92._12_4_);
        auVar210 = auVar210 | auVar102;
        iVar48 = movmskps((int)pSVar51,auVar210);
        if (iVar48 != 0) {
          auVar163._0_4_ = fVar226 * fVar227 - fVar189 * fVar183;
          auVar163._4_4_ = fVar230 * fVar231 - fVar191 * fVar190;
          auVar163._8_4_ = fVar232 * fVar233 - fVar195 * fVar194;
          auVar163._12_4_ = fVar234 * fVar235 - fVar198 * fVar196;
          auVar215._0_4_ = fVar189 * fVar212 - fVar221 * fVar227;
          auVar215._4_4_ = fVar191 * fVar197 - fVar144 * fVar231;
          auVar215._8_4_ = fVar195 * fVar112 - fVar216 * fVar233;
          auVar215._12_4_ = fVar198 * fVar171 - fVar134 * fVar235;
          auVar79._4_4_ = -(uint)(ABS(fVar191 * fVar190) < ABS(fVar144 * fVar231));
          auVar79._0_4_ = -(uint)(ABS(fVar189 * fVar183) < ABS(fVar221 * fVar227));
          auVar79._8_4_ = -(uint)(ABS(fVar195 * fVar194) < ABS(fVar216 * fVar233));
          auVar79._12_4_ = -(uint)(ABS(fVar198 * fVar196) < ABS(fVar134 * fVar235));
          local_ae8 = blendvps(auVar215,auVar163,auVar79);
          auVar219._0_4_ = fVar183 * fVar156 - fVar145 * fVar227;
          auVar219._4_4_ = fVar190 * fVar166 - fVar153 * fVar231;
          auVar219._8_4_ = fVar194 * fVar184 - fVar204 * fVar233;
          auVar219._12_4_ = fVar196 * fVar186 - fVar91 * fVar235;
          auVar151._0_4_ = fVar173 * fVar227 - fVar156 * fVar212;
          auVar151._4_4_ = fVar181 * fVar231 - fVar166 * fVar197;
          auVar151._8_4_ = fVar188 * fVar233 - fVar184 * fVar112;
          auVar151._12_4_ = fVar170 * fVar235 - fVar186 * fVar171;
          auVar80._4_4_ = -(uint)(ABS(fVar153 * fVar231) < ABS(fVar166 * fVar197));
          auVar80._0_4_ = -(uint)(ABS(fVar145 * fVar227) < ABS(fVar156 * fVar212));
          auVar80._8_4_ = -(uint)(ABS(fVar204 * fVar233) < ABS(fVar184 * fVar112));
          auVar80._12_4_ = -(uint)(ABS(fVar91 * fVar235) < ABS(fVar186 * fVar171));
          local_ad8 = blendvps(auVar151,auVar219,auVar80);
          auVar229._0_4_ = fVar145 * fVar189 - fVar156 * fVar226;
          auVar229._4_4_ = fVar153 * fVar191 - fVar166 * fVar230;
          auVar229._8_4_ = fVar204 * fVar195 - fVar184 * fVar232;
          auVar229._12_4_ = fVar91 * fVar198 - fVar186 * fVar234;
          auVar143._0_4_ = fVar156 * fVar221 - fVar173 * fVar189;
          auVar143._4_4_ = fVar166 * fVar144 - fVar181 * fVar191;
          auVar143._8_4_ = fVar184 * fVar216 - fVar188 * fVar195;
          auVar143._12_4_ = fVar186 * fVar134 - fVar170 * fVar198;
          auVar81._4_4_ = -(uint)(ABS(fVar166 * fVar230) < ABS(fVar181 * fVar191));
          auVar81._0_4_ = -(uint)(ABS(fVar156 * fVar226) < ABS(fVar173 * fVar189));
          auVar81._8_4_ = -(uint)(ABS(fVar184 * fVar232) < ABS(fVar188 * fVar195));
          auVar81._12_4_ = -(uint)(ABS(fVar186 * fVar234) < ABS(fVar170 * fVar198));
          local_ac8 = blendvps(auVar143,auVar229,auVar81);
          auVar103._0_4_ = fVar114 * local_ac8._0_4_;
          auVar103._4_4_ = fVar114 * local_ac8._4_4_;
          auVar103._8_4_ = fVar114 * local_ac8._8_4_;
          auVar103._12_4_ = fVar114 * local_ac8._12_4_;
          fVar90 = old_t_1 * local_ae8._0_4_ +
                   (float)local_d28._0_4_ * local_ad8._0_4_ + auVar103._0_4_;
          fVar114 = fStack_cf4 * local_ae8._4_4_ +
                    (float)local_d28._4_4_ * local_ad8._4_4_ + auVar103._4_4_;
          fVar221 = (float)uStack_cf0 * local_ae8._8_4_ +
                    fStack_d20 * local_ad8._8_4_ + auVar103._8_4_;
          fVar144 = uStack_cf0._4_4_ * local_ae8._12_4_ +
                    fStack_d1c * local_ad8._12_4_ + auVar103._12_4_;
          auVar130._0_4_ = fVar90 + fVar90;
          auVar130._4_4_ = fVar114 + fVar114;
          auVar130._8_4_ = fVar221 + fVar221;
          auVar130._12_4_ = fVar144 + fVar144;
          fVar155 = fVar179 * local_ae8._0_4_ +
                    fVar222 * local_ad8._0_4_ + fVar201 * local_ac8._0_4_;
          fVar216 = fVar182 * local_ae8._4_4_ +
                    fVar223 * local_ad8._4_4_ + fVar205 * local_ac8._4_4_;
          fVar132 = fVar202 * local_ae8._8_4_ +
                    fVar224 * local_ad8._8_4_ + fVar207 * local_ac8._8_4_;
          fVar134 = fVar152 * local_ae8._12_4_ +
                    fVar225 * local_ad8._12_4_ + fVar211 * local_ac8._12_4_;
          auVar92 = rcpps(auVar103,auVar130);
          fVar90 = auVar92._0_4_;
          fVar114 = auVar92._4_4_;
          fVar221 = auVar92._8_4_;
          fVar144 = auVar92._12_4_;
          local_af8._0_4_ =
               ((1.0 - auVar130._0_4_ * fVar90) * fVar90 + fVar90) * (fVar155 + fVar155);
          local_af8._4_4_ =
               ((1.0 - auVar130._4_4_ * fVar114) * fVar114 + fVar114) * (fVar216 + fVar216);
          local_af8._8_4_ =
               ((1.0 - auVar130._8_4_ * fVar221) * fVar221 + fVar221) * (fVar132 + fVar132);
          local_af8._12_4_ =
               ((1.0 - auVar130._12_4_ * fVar144) * fVar144 + fVar144) * (fVar134 + fVar134);
          fVar90 = *(float *)(ray + k * 4 + 0x80);
          fVar114 = *(float *)(ray + k * 4 + 0x30);
          auVar104._0_4_ =
               -(uint)(local_af8._0_4_ <= fVar90 && fVar114 <= local_af8._0_4_) & auVar210._0_4_;
          auVar104._4_4_ =
               -(uint)(local_af8._4_4_ <= fVar90 && fVar114 <= local_af8._4_4_) & auVar210._4_4_;
          auVar104._8_4_ =
               -(uint)(local_af8._8_4_ <= fVar90 && fVar114 <= local_af8._8_4_) & auVar210._8_4_;
          auVar104._12_4_ =
               -(uint)(local_af8._12_4_ <= fVar90 && fVar114 <= local_af8._12_4_) & auVar210._12_4_;
          iVar48 = movmskps(iVar48,auVar104);
          if (iVar48 != 0) {
            auVar105._0_4_ = auVar104._0_4_ & -(uint)(auVar130._0_4_ != 0.0);
            auVar105._4_4_ = auVar104._4_4_ & -(uint)(auVar130._4_4_ != 0.0);
            auVar105._8_4_ = auVar104._8_4_ & -(uint)(auVar130._8_4_ != 0.0);
            auVar105._12_4_ = auVar104._12_4_ & -(uint)(auVar130._12_4_ != 0.0);
            iVar48 = movmskps(iVar48,auVar105);
            if (iVar48 != 0) {
              auVar122._0_4_ = (float)local_c28._0_4_ - auVar162._0_4_;
              auVar122._4_4_ = (float)local_c28._4_4_ - auVar162._4_4_;
              auVar122._8_4_ = fStack_c20 - auVar162._8_4_;
              auVar122._12_4_ = register0x0000128c - auVar162._12_4_;
              auVar106._4_12_ = auVar105._4_12_;
              auVar106._0_4_ = (float)(int)(*(ushort *)(local_c00 + 8 + local_c08) - 1);
              auVar164._4_4_ = auVar105._4_4_;
              auVar164._0_4_ = auVar106._0_4_;
              auVar164._8_4_ = auVar105._8_4_;
              auVar164._12_4_ = auVar105._12_4_;
              auVar92 = rcpss(auVar164,auVar106);
              fVar114 = (2.0 - auVar106._0_4_ * auVar92._0_4_) * auVar92._0_4_;
              auVar165._4_12_ = auVar92._4_12_;
              auVar165._0_4_ = (float)(int)(*(ushort *)(local_c00 + 10 + local_c08) - 1);
              auVar178._4_4_ = auVar92._4_4_;
              auVar178._0_4_ = auVar165._0_4_;
              auVar178._8_4_ = auVar92._8_4_;
              auVar178._12_4_ = auVar92._12_4_;
              auVar92 = rcpss(auVar178,auVar165);
              fVar221 = (2.0 - auVar165._0_4_ * auVar92._0_4_) * auVar92._0_4_;
              pGVar24 = (context->scene->geometries).items[uVar52].ptr;
              if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0073ecd9;
                auVar92 = rcpps(auVar122,_local_c28);
                fVar144 = auVar92._0_4_;
                fVar155 = auVar92._4_4_;
                fVar216 = auVar92._8_4_;
                fVar132 = auVar92._12_4_;
                fVar144 = (float)(-(uint)(1e-18 <= ABS((float)local_c28._0_4_)) &
                                 (uint)(((float)DAT_01f46a60 - (float)local_c28._0_4_ * fVar144) *
                                        fVar144 + fVar144));
                fVar155 = (float)(-(uint)(1e-18 <= ABS((float)local_c28._4_4_)) &
                                 (uint)((DAT_01f46a60._4_4_ - (float)local_c28._4_4_ * fVar155) *
                                        fVar155 + fVar155));
                fVar216 = (float)(-(uint)(1e-18 <= ABS(fStack_c20)) &
                                 (uint)((DAT_01f46a60._8_4_ - fStack_c20 * fVar216) * fVar216 +
                                       fVar216));
                fVar132 = (float)(-(uint)(1e-18 <= ABS(register0x0000128c)) &
                                 (uint)((DAT_01f46a60._12_4_ - register0x0000128c * fVar132) *
                                        fVar132 + fVar132));
                auVar82._0_4_ =
                     fVar114 * ((float)uVar111 * (float)local_c28._0_4_ +
                               ((float)local_c28._0_4_ - fVar199)) * fVar144;
                auVar82._4_4_ =
                     fVar114 * ((float)(uVar111 + 1) * (float)local_c28._4_4_ +
                               ((float)local_c28._4_4_ - fVar200)) * fVar155;
                auVar82._8_4_ =
                     fVar114 * ((float)(uVar111 + 1) * fStack_c20 + (fStack_c20 - fVar203)) *
                     fVar216;
                auVar82._12_4_ =
                     fVar114 * ((float)uVar111 * register0x0000128c + (register0x0000128c - fVar220)
                               ) * fVar132;
                local_b18 = minps(auVar82,_DAT_01f46a60);
                auVar107._0_4_ =
                     fVar221 * ((float)uVar113 * (float)local_c28._0_4_ + auVar122._0_4_) * fVar144;
                auVar107._4_4_ =
                     fVar221 * ((float)uVar113 * (float)local_c28._4_4_ + auVar122._4_4_) * fVar155;
                auVar107._8_4_ =
                     fVar221 * ((float)(uVar113 + 1) * fStack_c20 + auVar122._8_4_) * fVar216;
                auVar107._12_4_ =
                     fVar221 * ((float)(uVar113 + 1) * register0x0000128c + auVar122._12_4_) *
                     fVar132;
                local_b08 = minps(auVar107,_DAT_01f46a60);
                local_d38._0_1_ = (byte)iVar48;
                uVar62 = (ulong)(byte)local_d38;
                uVar55 = 0;
                if (uVar62 != 0) {
                  for (; ((byte)local_d38 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                  }
                }
                local_cb8 = CONCAT44(uVar109,uVar109);
                uStack_cb0 = CONCAT44(uVar109,uVar109);
                RVar20 = (local_c10->super_AccelN).super_Accel.super_AccelData.super_RefCount;
                local_a78 = fStack_a6c;
                fStack_a74 = fStack_a6c;
                fStack_a70 = fStack_a6c;
                local_a68 = fStack_a5c;
                fStack_a64 = fStack_a5c;
                fStack_a60 = fStack_a5c;
                while (uVar62 != 0) {
                  local_9a8 = *(undefined4 *)(local_b18 + uVar55 * 4);
                  uVar57 = *(undefined4 *)(local_b08 + uVar55 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_af8 + uVar55 * 4);
                  args.context = context->user;
                  local_998._4_4_ = uVar57;
                  local_998._0_4_ = uVar57;
                  local_998._8_4_ = uVar57;
                  local_998._12_4_ = uVar57;
                  local_9d8 = *(undefined4 *)(local_ae8 + uVar55 * 4);
                  uVar57 = *(undefined4 *)(local_ad8 + uVar55 * 4);
                  uVar19 = *(undefined4 *)(local_ac8 + uVar55 * 4);
                  local_9c8._4_4_ = uVar57;
                  local_9c8._0_4_ = uVar57;
                  local_9c8._8_4_ = uVar57;
                  local_9c8._12_4_ = uVar57;
                  local_9b8._4_4_ = uVar19;
                  local_9b8._0_4_ = uVar19;
                  local_9b8._8_4_ = uVar19;
                  local_9b8._12_4_ = uVar19;
                  uStack_9d4 = local_9d8;
                  uStack_9d0 = local_9d8;
                  uStack_9cc = local_9d8;
                  uStack_9a4 = local_9a8;
                  uStack_9a0 = local_9a8;
                  uStack_99c = local_9a8;
                  local_988 = local_cb8;
                  uStack_980 = uStack_cb0;
                  local_978 = CONCAT44(uVar52,uVar52);
                  uStack_970 = CONCAT44(uVar52,uVar52);
                  local_968 = (args.context)->instID[0];
                  uStack_964 = local_968;
                  uStack_960 = local_968;
                  uStack_95c = local_968;
                  local_958 = (args.context)->instPrimID[0];
                  uStack_954 = local_958;
                  uStack_950 = local_958;
                  uStack_94c = local_958;
                  args.valid = (int *)&local_c38;
                  args.geometryUserPtr = pGVar24->userPtr;
                  args.hit = (RTCHitN *)&local_9d8;
                  args.N = 4;
                  local_c38 = RVar20;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar24->occlusionFilterN)(&args);
                  }
                  if (local_c38 == (RefCount)0x0) {
                    auVar108._8_4_ = 0xffffffff;
                    auVar108._0_8_ = 0xffffffffffffffff;
                    auVar108._12_4_ = 0xffffffff;
                    auVar108 = auVar108 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var28 = context->args->filter;
                    if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var28)(&args);
                    }
                    auVar83._0_4_ = -(uint)((int)local_c38._vptr_RefCount == 0);
                    auVar83._4_4_ = -(uint)(local_c38._vptr_RefCount._4_4_ == 0);
                    auVar83._8_4_ =
                         -(uint)((int)local_c38.refCounter.super___atomic_base<unsigned_long>._M_i
                                == 0);
                    auVar83._12_4_ =
                         -(uint)(local_c38.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_
                                == 0);
                    auVar108 = auVar83 ^ _DAT_01f46b70;
                    auVar92 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar83
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar92;
                  }
                  if ((_DAT_01f46b40 & auVar108) != (undefined1  [16])0x0) goto LAB_0073ecd9;
                  *(float *)(ray + k * 4 + 0x80) = fVar90;
                  uVar62 = uVar62 ^ 1L << (uVar55 & 0x3f);
                  uVar55 = 0;
                  if (uVar62 != 0) {
                    for (; (uVar62 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
        fVar114 = local_8e8;
        fVar216 = fStack_8e4;
        fVar132 = fStack_8e0;
        fVar134 = fStack_8dc;
        fVar221 = local_8f8;
        fVar136 = fStack_8f4;
        fVar145 = fStack_8f0;
        fVar153 = fStack_8ec;
        fVar90 = local_8d8;
        fVar201 = fStack_8d4;
        fVar205 = fStack_8d0;
        fVar207 = fStack_8cc;
        fVar211 = fStack_900;
        fVar212 = fStack_8fc;
      }
      root.ptr = 0;
      aVar213 = bi_5.field_0;
      fVar144 = local_a28;
      fVar204 = fStack_a24;
      fVar91 = fStack_a20;
      fVar156 = fStack_a1c;
      fVar155 = local_a38;
      fVar166 = fStack_a34;
      fVar184 = fStack_a30;
      fVar186 = fStack_a2c;
      fVar170 = local_a48;
      fVar173 = fStack_a44;
      fVar181 = fStack_a40;
      fVar188 = fStack_a3c;
    }
LAB_0073ecbf:
    local_cc0 = local_d00;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }